

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

bool __thiscall
Jinx::Impl::Parser::CheckProperty(Parser *this,SymbolListCItr currSym,size_t *symCount)

{
  bool bVar1;
  pointer pSVar2;
  element_type *peVar3;
  bool local_139;
  bool local_109;
  shared_ptr<Jinx::Impl::Library> local_f8;
  undefined1 local_e8 [8];
  LibraryIPtr library_1;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *importName;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
  *__range2;
  shared_ptr<Jinx::Impl::Library> local_b0;
  Symbol *local_a0;
  shared_ptr<Jinx::Impl::Library> local_98 [2];
  undefined1 local_78 [8];
  LibraryIPtr library;
  __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
  local_60;
  __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
  local_58;
  SymbolListCItr currentSymbol;
  String libraryName;
  size_t *symCount_local;
  Parser *this_local;
  SymbolListCItr currSym_local;
  
  local_109 = true;
  this_local = (Parser *)currSym._M_current;
  if ((this->m_error & 1U) == 0) {
    libraryName.field_2._8_8_ =
         std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::end
                   (this->m_symbolList);
    local_109 = __gnu_cxx::operator==
                          ((__normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                            *)&this_local,
                           (__normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                            *)((long)&libraryName.field_2 + 8));
  }
  if (local_109 == false) {
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
             ::operator->((__normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                           *)&this_local);
    if (pSVar2->type == NameValue) {
      CheckLibraryName_abi_cxx11_((String *)&currentSymbol,this);
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                    &currentSymbol);
      if (bVar1) {
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_library);
        if (!bVar1) {
          __assert_fail("m_library",
                        "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxParser.cpp"
                        ,0x34c,
                        "bool Jinx::Impl::Parser::CheckProperty(SymbolListCItr, size_t *) const");
        }
        std::shared_ptr<Jinx::Impl::Library>::shared_ptr(&local_b0,&this->m_library);
        bVar1 = CheckPropertyName(this,&local_b0,(SymbolListCItr)this_local,symCount);
        std::shared_ptr<Jinx::Impl::Library>::~shared_ptr(&local_b0);
        if (bVar1) {
          currSym_local._M_current._7_1_ = 1;
          library.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi._4_4_ = 1;
        }
        else {
          __end2 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
                   ::begin(&this->m_importList);
          importName = (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                       std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
                       ::end(&this->m_importList);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>_>
                                             *)&importName), bVar1) {
            library_1.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>_>
                 ::operator*(&__end2);
            peVar3 = std::
                     __shared_ptr_access<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&this->m_runtime);
            Runtime::GetLibraryInternal((Runtime *)local_e8,(String *)peVar3);
            bVar1 = std::operator!=((shared_ptr<Jinx::Impl::Library> *)local_e8,&this->m_library);
            local_139 = false;
            if (bVar1) {
              std::shared_ptr<Jinx::Impl::Library>::shared_ptr
                        (&local_f8,(shared_ptr<Jinx::Impl::Library> *)local_e8);
              local_139 = CheckPropertyName(this,&local_f8,(SymbolListCItr)this_local,symCount);
              std::shared_ptr<Jinx::Impl::Library>::~shared_ptr(&local_f8);
            }
            if (local_139 != false) {
              currSym_local._M_current._7_1_ = 1;
            }
            library.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi._5_3_ = 0;
            library.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi._4_1_ = local_139 != false;
            std::shared_ptr<Jinx::Impl::Library>::~shared_ptr
                      ((shared_ptr<Jinx::Impl::Library> *)local_e8);
            if (library.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi._4_4_ != 0) goto LAB_001658d1;
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>_>
            ::operator++(&__end2);
          }
          currSym_local._M_current._7_1_ = 0;
          library.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi._4_4_ = 1;
        }
      }
      else {
        local_58._M_current = (Symbol *)this_local;
        __gnu_cxx::
        __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
        ::operator++(&local_58);
        local_60._M_current =
             (Symbol *)
             std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::end
                       (this->m_symbolList);
        bVar1 = __gnu_cxx::operator==(&local_58,&local_60);
        if (bVar1) {
          currSym_local._M_current._7_1_ = 0;
          library.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi._4_4_ = 1;
        }
        else {
          pSVar2 = __gnu_cxx::
                   __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                   ::operator->(&local_58);
          if (pSVar2->type == NameValue) {
            peVar3 = std::
                     __shared_ptr_access<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&this->m_runtime);
            Runtime::GetLibraryInternal((Runtime *)local_78,(String *)peVar3);
            bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_78);
            if (!bVar1) {
              __assert_fail("library",
                            "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxParser.cpp"
                            ,0x347,
                            "bool Jinx::Impl::Parser::CheckProperty(SymbolListCItr, size_t *) const"
                           );
            }
            std::shared_ptr<Jinx::Impl::Library>::shared_ptr
                      (local_98,(shared_ptr<Jinx::Impl::Library> *)local_78);
            local_a0 = local_58._M_current;
            currSym_local._M_current._7_1_ =
                 CheckPropertyName(this,local_98,(SymbolListCItr)local_58._M_current,symCount);
            std::shared_ptr<Jinx::Impl::Library>::~shared_ptr(local_98);
            library.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi._4_4_ = 1;
            std::shared_ptr<Jinx::Impl::Library>::~shared_ptr
                      ((shared_ptr<Jinx::Impl::Library> *)local_78);
          }
          else {
            currSym_local._M_current._7_1_ = 0;
            library.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi._4_4_ = 1;
          }
        }
      }
LAB_001658d1:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                    &currentSymbol);
    }
    else {
      currSym_local._M_current._7_1_ = 0;
    }
  }
  else {
    currSym_local._M_current._7_1_ = 0;
  }
  return (bool)(currSym_local._M_current._7_1_ & 1);
}

Assistant:

inline_t bool Parser::CheckProperty(SymbolListCItr currSym, size_t * symCount) const
	{
		// Check symbol validity
		if (m_error || currSym == m_symbolList.end())
			return false;
		if (currSym->type != SymbolType::NameValue)
			return false;

		// Check to see if this begins with a library name
		String libraryName = CheckLibraryName();
		if (!libraryName.empty())
		{
			// Get next symbol and check validity
			auto currentSymbol = currSym;
			++currentSymbol;
			if (currentSymbol == m_symbolList.end())
				return false;
			if (currentSymbol->type != SymbolType::NameValue)
				return false;

			// Check for property name in this specific library
			auto library = m_runtime->GetLibraryInternal(libraryName);
			assert(library);
			return CheckPropertyName(library, currentSymbol, symCount);
		}

		// Check for property name in the current library
		assert(m_library);
		if (CheckPropertyName(m_library, currSym, symCount))
			return true;

		// Check against all imported libraries
		for (auto & importName : m_importList)
		{
			auto library = m_runtime->GetLibraryInternal(importName);
			if (library != m_library && CheckPropertyName(library, currSym, symCount))
				return true;
		}
		return false;
	}